

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simple_Apu.cpp
# Opt level: O0

void __thiscall Simple_Apu::Simple_Apu(Simple_Apu *this)

{
  Nes_Apu *in_RDI;
  long in_stack_ffffffffffffffc8;
  Nes_Apu *buffer;
  Nes_Apu *this_00;
  Blip_Buffer *in_stack_ffffffffffffffe8;
  
  buffer = in_RDI;
  Nes_Apu::Nes_Apu(in_RDI);
  this_00 = buffer + 1;
  Blip_Buffer::Blip_Buffer((Blip_Buffer *)this_00);
  in_RDI[1].square1.super_Nes_Envelope.envelope = 0;
  in_RDI[1].square1.super_Nes_Envelope.env_delay = 0;
  in_RDI[1].square1.phase = 0x7454;
  in_RDI[1].square1.sweep_delay = 0;
  Nes_Apu::dmc_reader(in_RDI,null_dmc_reader,(void *)0x0);
  Nes_Apu::output(this_00,(Blip_Buffer *)buffer);
  Blip_Buffer::clock_rate((Blip_Buffer *)in_RDI,in_stack_ffffffffffffffc8);
  Blip_Buffer::sample_rate(in_stack_ffffffffffffffe8,(long)this_00,(int)((ulong)buffer >> 0x20));
  Nes_Apu::reset(this_00,SUB81((ulong)buffer >> 0x38,0),(int)buffer);
  Blip_Buffer::clear((Blip_Buffer *)this_00,SUB81((ulong)buffer >> 0x38,0));
  return;
}

Assistant:

Simple_Apu::Simple_Apu()
{
	time = 0;
	frame_length = 29780;
	apu.dmc_reader( null_dmc_reader, NULL );

	apu.output( &buf );
	buf.clock_rate( 1789773 );
	buf.sample_rate( 44100, 1000 );

	apu.reset(false, 0);
	buf.clear();
}